

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_enum.cc
# Opt level: O0

void init_enum(module *m)

{
  enum_<kratos::PortType> *peVar1;
  enum_<kratos::PortDirection> *peVar2;
  enum_<kratos::HashStrategy> *peVar3;
  enum_<kratos::StatementType> *peVar4;
  enum_<kratos::AssignmentType> *peVar5;
  enum_<kratos::StatementBlockType> *peVar6;
  enum_<kratos::EventEdgeType> *peVar7;
  enum_<kratos::IRNodeKind> *peVar8;
  enum_<kratos::VarCastType> *peVar9;
  enum_<kratos::PropertyAction> *peVar10;
  enum_<kratos::ParamType> *peVar11;
  enum_<kratos::EventActionType> *peVar12;
  enum_<kratos::EventControl::DelaySide> *this;
  enum_<kratos::EventControl::DelaySide> local_178;
  enum_<kratos::EventActionType> local_160;
  enum_<kratos::AuxiliaryType> local_148;
  enum_<kratos::ParamType> local_130;
  enum_<kratos::PropertyAction> local_118;
  enum_<kratos::VarCastType> local_100;
  enum_<kratos::IRNodeKind> local_e8;
  type local_c9;
  enum_<kratos::EventEdgeType> local_c8;
  enum_<kratos::StatementBlockType> local_b0;
  enum_<kratos::AssignmentType> local_98;
  enum_<kratos::StatementType> local_80;
  enum_<kratos::HashStrategy> local_68;
  enum_<kratos::PortDirection> local_50;
  enum_<kratos::PortType> local_28;
  handle *local_10;
  module *m_local;
  
  local_10 = (handle *)m;
  pybind11::enum_<kratos::PortType>::enum_<>(&local_28,(handle *)m,"PortType");
  peVar1 = pybind11::enum_<kratos::PortType>::value(&local_28,"Clock",Clock,(char *)0x0);
  peVar1 = pybind11::enum_<kratos::PortType>::value(peVar1,"AsyncReset",AsyncReset,(char *)0x0);
  peVar1 = pybind11::enum_<kratos::PortType>::value(peVar1,"ClockEnable",ClockEnable,(char *)0x0);
  peVar1 = pybind11::enum_<kratos::PortType>::value(peVar1,"Data",Data,(char *)0x0);
  peVar1 = pybind11::enum_<kratos::PortType>::value(peVar1,"Reset",Reset,(char *)0x0);
  pybind11::enum_<kratos::PortType>::export_values(peVar1);
  pybind11::enum_<kratos::PortType>::~enum_(&local_28);
  pybind11::enum_<kratos::PortDirection>::enum_<>(&local_50,local_10,"PortDirection");
  peVar2 = pybind11::enum_<kratos::PortDirection>::value(&local_50,"In",In,(char *)0x0);
  peVar2 = pybind11::enum_<kratos::PortDirection>::value(peVar2,"Out",Out,(char *)0x0);
  peVar2 = pybind11::enum_<kratos::PortDirection>::value(peVar2,"InOut",InOut,(char *)0x0);
  pybind11::enum_<kratos::PortDirection>::export_values(peVar2);
  pybind11::enum_<kratos::PortDirection>::~enum_(&local_50);
  pybind11::enum_<kratos::HashStrategy>::enum_<>(&local_68,local_10,"HashStrategy");
  peVar3 = pybind11::enum_<kratos::HashStrategy>::value
                     (&local_68,"SequentialHash",SequentialHash,(char *)0x0);
  peVar3 = pybind11::enum_<kratos::HashStrategy>::value
                     (peVar3,"ParallelHash",ParallelHash,(char *)0x0);
  pybind11::enum_<kratos::HashStrategy>::export_values(peVar3);
  pybind11::enum_<kratos::HashStrategy>::~enum_(&local_68);
  pybind11::enum_<kratos::StatementType>::enum_<>(&local_80,local_10,"StatementType");
  peVar4 = pybind11::enum_<kratos::StatementType>::value(&local_80,"If",If,(char *)0x0);
  peVar4 = pybind11::enum_<kratos::StatementType>::value(peVar4,"Switch",Switch,(char *)0x0);
  peVar4 = pybind11::enum_<kratos::StatementType>::value(peVar4,"Assign",Assign,(char *)0x0);
  peVar4 = pybind11::enum_<kratos::StatementType>::value(peVar4,"Block",Block,(char *)0x0);
  peVar4 = pybind11::enum_<kratos::StatementType>::value
                     (peVar4,"ModuleInstantiation",ModuleInstantiation,(char *)0x0);
  pybind11::enum_<kratos::StatementType>::export_values(peVar4);
  pybind11::enum_<kratos::StatementType>::~enum_(&local_80);
  pybind11::enum_<kratos::AssignmentType>::enum_<>(&local_98,local_10,"AssignmentType");
  peVar5 = pybind11::enum_<kratos::AssignmentType>::value(&local_98,"Blocking",Blocking,(char *)0x0)
  ;
  peVar5 = pybind11::enum_<kratos::AssignmentType>::value
                     (peVar5,"NonBlocking",NonBlocking,(char *)0x0);
  peVar5 = pybind11::enum_<kratos::AssignmentType>::value(peVar5,"Undefined",Undefined,(char *)0x0);
  pybind11::enum_<kratos::AssignmentType>::export_values(peVar5);
  pybind11::enum_<kratos::AssignmentType>::~enum_(&local_98);
  pybind11::enum_<kratos::StatementBlockType>::enum_<>(&local_b0,local_10,"StatementBlockType");
  peVar6 = pybind11::enum_<kratos::StatementBlockType>::value
                     (&local_b0,"Combinational",Combinational,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementBlockType>::value
                     (peVar6,"Sequential",Sequential,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementBlockType>::value(peVar6,"Initial",Initial,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementBlockType>::value(peVar6,"Latch",Latch,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementBlockType>::value(peVar6,"Final",Final,(char *)0x0);
  pybind11::enum_<kratos::StatementBlockType>::export_values(peVar6);
  pybind11::enum_<kratos::StatementBlockType>::~enum_(&local_b0);
  pybind11::enum_<kratos::EventEdgeType>::enum_<>(&local_c8,local_10,"EventEdgeType");
  peVar7 = pybind11::enum_<kratos::EventEdgeType>::value(&local_c8,"Posedge",Posedge,(char *)0x0);
  peVar7 = pybind11::enum_<kratos::EventEdgeType>::value(peVar7,"Negedge",Negedge,(char *)0x0);
  pybind11::class_<kratos::EventEdgeType>::def<init_enum(pybind11::module_&)::__0>
            (&peVar7->super_class_<kratos::EventEdgeType>,"__call__",&local_c9);
  pybind11::enum_<kratos::EventEdgeType>::~enum_(&local_c8);
  pybind11::enum_<kratos::IRNodeKind>::enum_<>(&local_e8,local_10,"IRNodeKind");
  peVar8 = pybind11::enum_<kratos::IRNodeKind>::value
                     (&local_e8,"GeneratorKind",GeneratorKind,(char *)0x0);
  peVar8 = pybind11::enum_<kratos::IRNodeKind>::value(peVar8,"VarKind",VarKind,(char *)0x0);
  peVar8 = pybind11::enum_<kratos::IRNodeKind>::value(peVar8,"StmtKind",StmtKind,(char *)0x0);
  pybind11::enum_<kratos::IRNodeKind>::export_values(peVar8);
  pybind11::enum_<kratos::IRNodeKind>::~enum_(&local_e8);
  pybind11::enum_<kratos::VarCastType>::enum_<>(&local_100,local_10,"VarCastType");
  peVar9 = pybind11::enum_<kratos::VarCastType>::value(&local_100,"Signed",Signed,(char *)0x0);
  peVar9 = pybind11::enum_<kratos::VarCastType>::value(peVar9,"Unsigned",Unsigned,(char *)0x0);
  peVar9 = pybind11::enum_<kratos::VarCastType>::value(peVar9,"AsyncReset",AsyncReset,(char *)0x0);
  peVar9 = pybind11::enum_<kratos::VarCastType>::value(peVar9,"ClockEnable",ClockEnable,(char *)0x0)
  ;
  peVar9 = pybind11::enum_<kratos::VarCastType>::value(peVar9,"Clock",Clock,(char *)0x0);
  peVar9 = pybind11::enum_<kratos::VarCastType>::value(peVar9,"Enum",Enum,(char *)0x0);
  pybind11::enum_<kratos::VarCastType>::value(peVar9,"Resize",Resize,(char *)0x0);
  pybind11::enum_<kratos::VarCastType>::~enum_(&local_100);
  pybind11::enum_<kratos::PropertyAction>::enum_<>(&local_118,local_10,"PropertyAction");
  peVar10 = pybind11::enum_<kratos::PropertyAction>::value(&local_118,"None",None,(char *)0x0);
  peVar10 = pybind11::enum_<kratos::PropertyAction>::value(peVar10,"Cover",Cover,(char *)0x0);
  peVar10 = pybind11::enum_<kratos::PropertyAction>::value(peVar10,"Assume",Assume,(char *)0x0);
  pybind11::enum_<kratos::PropertyAction>::value(peVar10,"Assert",Assert,(char *)0x0);
  pybind11::enum_<kratos::PropertyAction>::~enum_(&local_118);
  pybind11::enum_<kratos::ParamType>::enum_<>(&local_130,local_10,"ParamType");
  peVar11 = pybind11::enum_<kratos::ParamType>::value(&local_130,"RawType",RawType,(char *)0x0);
  peVar11 = pybind11::enum_<kratos::ParamType>::value(peVar11,"Parameter",Parameter,(char *)0x0);
  peVar11 = pybind11::enum_<kratos::ParamType>::value(peVar11,"Enum",Enum,(char *)0x0);
  pybind11::enum_<kratos::ParamType>::value(peVar11,"Integral",Integral,(char *)0x0);
  pybind11::enum_<kratos::ParamType>::~enum_(&local_130);
  pybind11::enum_<kratos::AuxiliaryType>::enum_<>(&local_148,local_10,"AuxiliaryType");
  pybind11::enum_<kratos::AuxiliaryType>::value(&local_148,"Event",EventTracing,(char *)0x0);
  pybind11::enum_<kratos::AuxiliaryType>::~enum_(&local_148);
  pybind11::enum_<kratos::EventActionType>::enum_<>(&local_160,local_10,"EventActionType");
  peVar12 = pybind11::enum_<kratos::EventActionType>::value(&local_160,"None_",None,(char *)0x0);
  peVar12 = pybind11::enum_<kratos::EventActionType>::value(peVar12,"Start",Start,(char *)0x0);
  pybind11::enum_<kratos::EventActionType>::value(peVar12,"End",End,(char *)0x0);
  pybind11::enum_<kratos::EventActionType>::~enum_(&local_160);
  pybind11::enum_<kratos::EventControl::DelaySide>::enum_<>(&local_178,local_10,"DelaySide");
  this = pybind11::enum_<kratos::EventControl::DelaySide>::value(&local_178,"Left",left,(char *)0x0)
  ;
  pybind11::enum_<kratos::EventControl::DelaySide>::value(this,"Right",right,(char *)0x0);
  pybind11::enum_<kratos::EventControl::DelaySide>::~enum_(&local_178);
  return;
}

Assistant:

void init_enum(py::module &m) {
    using namespace kratos;
    py::enum_<PortType>(m, "PortType")
        .value("Clock", PortType::Clock)
        .value("AsyncReset", PortType::AsyncReset)
        .value("ClockEnable", PortType::ClockEnable)
        .value("Data", PortType::Data)
        .value("Reset", PortType::Reset)
        .export_values();

    py::enum_<PortDirection>(m, "PortDirection")
        .value("In", PortDirection::In)
        .value("Out", PortDirection::Out)
        .value("InOut", PortDirection::InOut)
        .export_values();

    py::enum_<HashStrategy>(m, "HashStrategy")
        .value("SequentialHash", HashStrategy::SequentialHash)
        .value("ParallelHash", HashStrategy::ParallelHash)
        .export_values();

    py::enum_<StatementType>(m, "StatementType")
        .value("If", StatementType::If)
        .value("Switch", StatementType::Switch)
        .value("Assign", StatementType::Assign)
        .value("Block", StatementType::Block)
        .value("ModuleInstantiation", StatementType::ModuleInstantiation)
        .export_values();

    py::enum_<AssignmentType>(m, "AssignmentType")
        .value("Blocking", AssignmentType::Blocking)
        .value("NonBlocking", AssignmentType::NonBlocking)
        .value("Undefined", AssignmentType::Undefined)
        .export_values();

    py::enum_<StatementBlockType>(m, "StatementBlockType")
        .value("Combinational", StatementBlockType::Combinational)
        .value("Sequential", StatementBlockType::Sequential)
        .value("Initial", StatementBlockType::Initial)
        .value("Latch", StatementBlockType::Latch)
        .value("Final", StatementBlockType::Final)
        .export_values();

    py::enum_<EventEdgeType>(m, "EventEdgeType")
        .value("Posedge", EventEdgeType::Posedge)
        .value("Negedge", EventEdgeType::Negedge)
        .def("__call__", [](EventEdgeType type, Var &var) {
            auto event = EventControl(type, var);
            auto stmt = std::make_shared<EventDelayStmt>(event);
            return stmt;
        });

    py::enum_<IRNodeKind>(m, "IRNodeKind")
        .value("GeneratorKind", IRNodeKind::GeneratorKind)
        .value("VarKind", IRNodeKind::VarKind)
        .value("StmtKind", IRNodeKind::StmtKind)
        .export_values();

    py::enum_<VarCastType>(m, "VarCastType")
        .value("Signed", VarCastType::Signed)
        .value("Unsigned", VarCastType::Unsigned)
        .value("AsyncReset", VarCastType::AsyncReset)
        .value("ClockEnable", VarCastType::ClockEnable)
        .value("Clock", VarCastType::Clock)
        .value("Enum", VarCastType::Enum)
        .value("Resize", VarCastType::Resize);

    py::enum_<PropertyAction>(m, "PropertyAction")
        .value("None", PropertyAction::None)
        .value("Cover", PropertyAction::Cover)
        .value("Assume", PropertyAction::Assume)
        .value("Assert", PropertyAction::Assert);

    py::enum_<ParamType>(m, "ParamType")
        .value("RawType", ParamType::RawType)
        .value("Parameter", ParamType::Parameter)
        .value("Enum", ParamType::Enum)
        .value("Integral", ParamType::Integral);

    py::enum_<AuxiliaryType>(m, "AuxiliaryType").value("Event", AuxiliaryType::EventTracing);

    py::enum_<EventActionType>(m, "EventActionType")
        .value("None_", EventActionType::None)
        .value("Start", EventActionType::Start)
        .value("End", EventActionType::End);

    py::enum_<EventControl::DelaySide>(m, "DelaySide")
        .value("Left", EventControl::DelaySide::left)
        .value("Right", EventControl::DelaySide::right);
}